

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Detonation_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::LE_Detonation_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,LE_Detonation_PDU *this)

{
  byte bVar1;
  ostream *poVar2;
  ostream *poVar3;
  KINT32 Value;
  char cVar4;
  ulong uVar5;
  KString local_380;
  KString local_360;
  undefined1 local_340 [392];
  KStringStream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  LE_Header::GetAsString_abi_cxx11_((KString *)local_340,&this->super_LE_Header);
  poVar2 = std::operator<<(local_1a8,(string *)local_340);
  poVar2 = std::operator<<(poVar2,"-LE Detonation PDU-\n");
  poVar2 = std::operator<<(poVar2,"Optional Field Flags:\n");
  poVar2 = std::operator<<(poVar2,"\tTarget ID:                            ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->m_DetonationFlag1Union).m_ui8Flag & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tMunition ID:                          ");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(this->m_DetonationFlag1Union).m_ui8Flag >> 2 & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tMunition Site & Application Included: ");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(this->m_DetonationFlag1Union).m_ui8Flag >> 1 & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tEvent Site & Application Included:    ");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(this->m_DetonationFlag1Union).m_ui8Flag >> 3 & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tWarhead & Fuse Included:              ");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(this->m_DetonationFlag1Union).m_ui8Flag >> 4 & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tQuantity & Rate Included:             ");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(this->m_DetonationFlag1Union).m_ui8Flag >> 5 & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tLocation In Entity Coordinates:       ");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(this->m_DetonationFlag1Union).m_ui8Flag >> 6 & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tFlag 2:                               ");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(ushort)((this->m_DetonationFlag1Union).m_ui8Flag >> 7));
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)local_340);
  bVar1 = (this->m_DetonationFlag1Union).m_ui8Flag;
  if ((char)bVar1 < '\0') {
    poVar2 = std::operator<<(local_1a8,"\tMunition Orientation: ");
    poVar2 = (ostream *)
             std::ostream::operator<<(poVar2,(this->m_DetonationFlag2Union).m_ui8Flag & 1);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tEvent Number: ");
    poVar2 = (ostream *)
             std::ostream::operator<<(poVar2,(this->m_DetonationFlag2Union).m_ui8Flag >> 1 & 1);
    std::operator<<(poVar2,"\n");
    bVar1 = (this->m_DetonationFlag1Union).m_ui8Flag;
  }
  if ((bVar1 & 1) != 0) {
    poVar2 = std::operator<<(local_1a8,"Target ID: ");
    DATA_TYPE::LE_EntityIdentifier::GetAsString_abi_cxx11_((KString *)local_340,&this->m_TargetID);
    std::operator<<(poVar2,(string *)local_340);
    std::__cxx11::string::~string((string *)local_340);
    bVar1 = (this->m_DetonationFlag1Union).m_ui8Flag;
  }
  if ((bVar1 & 4) != 0) {
    poVar2 = std::operator<<(local_1a8,"Munition ID: ");
    DATA_TYPE::LE_EntityIdentifier::GetAsString_abi_cxx11_((KString *)local_340,&this->m_MunitionID)
    ;
    std::operator<<(poVar2,(string *)local_340);
    std::__cxx11::string::~string((string *)local_340);
    bVar1 = (this->m_DetonationFlag1Union).m_ui8Flag;
  }
  if ((char)bVar1 < '\0') {
    if ((bVar1 & 8) == 0 && ((this->m_DetonationFlag2Union).m_ui8Flag & 2) == 0) goto LAB_00145269;
  }
  else if ((bVar1 & 8) == 0) goto LAB_00145269;
  poVar2 = std::operator<<(local_1a8,"Event ID: ");
  DATA_TYPE::LE_EntityIdentifier::GetAsString_abi_cxx11_((KString *)local_340,&this->m_EventID);
  std::operator<<(poVar2,(string *)local_340);
  std::__cxx11::string::~string((string *)local_340);
LAB_00145269:
  DATA_TYPE::MunitionDescriptor::GetAsString_abi_cxx11_((KString *)local_340,&this->m_MunitionDesc);
  std::operator<<(local_1a8,(string *)local_340);
  std::__cxx11::string::~string((string *)local_340);
  if (((this->m_DetonationFlag1Union).m_ui8Flag & 0x40) == 0) {
    poVar3 = std::operator<<(local_1a8,"Location(World Coordinates):\n");
    DATA_TYPE::RelativeWorldCoordinates::GetAsString_abi_cxx11_(&local_360,&this->m_LocWrldCoord);
    std::__cxx11::stringstream::stringstream((stringstream *)local_340);
    poVar2 = (ostream *)(local_340 + 0x10);
    std::operator<<(poVar2,'\t');
    for (uVar5 = 0; uVar5 = uVar5 & 0xffff, uVar5 < local_360._M_string_length;
        uVar5 = (ulong)((int)uVar5 + 1)) {
      cVar4 = local_360._M_dataplus._M_p[uVar5];
      if (local_360._M_string_length - 1 != uVar5 && cVar4 == '\n') {
        cVar4 = '\t';
        std::operator<<(poVar2,'\n');
      }
      std::operator<<(poVar2,cVar4);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::operator<<(poVar3,(string *)&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_360);
  }
  else {
    poVar2 = std::operator<<(local_1a8,"Location(Entity Coordinates): ");
    DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,(unsigned_char)3>>::GetAsString_abi_cxx11_
              ((KString *)local_340,&this->m_LocEntCoord);
    std::operator<<(poVar2,(string *)local_340);
    std::__cxx11::string::~string((string *)local_340);
  }
  poVar2 = std::operator<<(local_1a8,"Velocity: ");
  DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,(unsigned_char)3>>::GetAsString_abi_cxx11_
            ((KString *)local_340,&this->m_Vel);
  std::operator<<(poVar2,(string *)local_340);
  std::__cxx11::string::~string((string *)local_340);
  if (((char)(this->m_DetonationFlag1Union).m_ui8Flag < '\0') &&
     (((this->m_DetonationFlag2Union).m_ui8Flag & 1) != 0)) {
    poVar2 = std::operator<<(local_1a8,"Munition Orienation: ");
    DATA_TYPE::LE_EulerAngles::GetAsString_abi_cxx11_((KString *)local_340,&this->m_Ori);
    std::operator<<(poVar2,(string *)local_340);
    std::__cxx11::string::~string((string *)local_340);
  }
  DATA_TYPE::MunitionDescriptor::GetAsString_abi_cxx11_((KString *)local_340,&this->m_MunitionDesc);
  poVar2 = std::operator<<(local_1a8,(string *)local_340);
  DATA_TYPE::ENUMS::GetEnumAsStringDetonationResult_abi_cxx11_
            (&local_380,(ENUMS *)(ulong)this->m_ui8DetonationResult,Value);
  poVar2 = std::operator<<(poVar2,(string *)&local_380);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)local_340);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

KString LE_Detonation_PDU::GetAsString() const
{
    KStringStream ss;

    ss << LE_Header::GetAsString()
       << "-LE Detonation PDU-\n"
       << "Optional Field Flags:\n"
       << "\tTarget ID:                            " << ( KUINT16 )m_DetonationFlag1Union.m_ui8TargetId        << "\n"
       << "\tMunition ID:                          " << ( KUINT16 )m_DetonationFlag1Union.m_ui8MunitionId      << "\n"
       << "\tMunition Site & Application Included: " << ( KUINT16 )m_DetonationFlag1Union.m_ui8MunitionSiteApp << "\n"
       << "\tEvent Site & Application Included:    " << ( KUINT16 )m_DetonationFlag1Union.m_ui8EventSiteAppId  << "\n"
       << "\tWarhead & Fuse Included:              " << ( KUINT16 )m_DetonationFlag1Union.m_ui8WarheadFuse     << "\n"
       << "\tQuantity & Rate Included:             " << ( KUINT16 )m_DetonationFlag1Union.m_ui8QuantRate       << "\n"
       << "\tLocation In Entity Coordinates:       " << ( KUINT16 )m_DetonationFlag1Union.m_ui8LocationTyp     << "\n"
       << "\tFlag 2:                               " << ( KUINT16 )m_DetonationFlag1Union.m_ui8Flag2           << "\n";
    
    if (m_DetonationFlag1Union.m_ui8Flag2)
    {
        ss << "\tMunition Orientation: " << (KUINT16)m_DetonationFlag2Union.m_ui8MunitionOri << "\n"
           << "\tEvent Number: " << (KUINT16)m_DetonationFlag2Union.m_ui8EventNum            << "\n";
    }

    if( m_DetonationFlag1Union.m_ui8TargetId )
    {
        ss << "Target ID: " << m_TargetID.GetAsString();
    }

    if( m_DetonationFlag1Union.m_ui8MunitionId )
    {
        ss << "Munition ID: " << m_MunitionID.GetAsString();
    }

    if( ( m_DetonationFlag1Union.m_ui8Flag2 && m_DetonationFlag2Union.m_ui8EventNum ) || m_DetonationFlag1Union.m_ui8EventSiteAppId )
    {
        ss << "Event ID: " << m_EventID.GetAsString();
    }

    ss << m_MunitionDesc.GetAsString();

    if( m_DetonationFlag1Union.m_ui8LocationTyp )
    {
        ss << "Location(Entity Coordinates): " << m_LocEntCoord.GetAsString();
    }
    else
    {
        ss << "Location(World Coordinates):\n" << IndentString( m_LocWrldCoord.GetAsString(), 1 );
    }

    ss << "Velocity: " << m_Vel.GetAsString();

    if( m_DetonationFlag1Union.m_ui8Flag2 && m_DetonationFlag2Union.m_ui8MunitionOri )
    {
        ss << "Munition Orienation: " << m_Ori.GetAsString();
    }

    ss << m_MunitionDesc.GetAsString()
       << GetEnumAsStringDetonationResult( m_ui8DetonationResult )
       << "\n";

    return ss.str();
}